

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Number::setNum(Number *this,int64_t val)

{
  ostream *poVar1;
  string local_1c0 [32];
  int local_1a0;
  ostringstream local_190 [8];
  ostringstream out;
  int64_t val_local;
  Number *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,std::noshowbase);
  local_1a0 = (int)std::setbase(10);
  poVar1 = std::operator<<(poVar1,(_Setbase)local_1a0);
  std::ostream::operator<<(poVar1,val);
  this->num = val;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&(this->super_AbstractAstNode).value,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void MyCompiler::Number::setNum(int64_t val)
{
    std::ostringstream out;
    out << std::noshowbase << std::setbase(10) << val;
    num = val;
    value = out.str();
}